

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystem.cpp
# Opt level: O2

void __thiscall chrono::ChSystem::StateGather(ChSystem *this,ChState *x,ChStateDelta *v,double *T)

{
  element_type *peVar1;
  
  ChAssembly::IntStateGather(&this->assembly,0,x,0,v,T);
  peVar1 = (this->contact_container).
           super___shared_ptr<chrono::ChContactContainer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*(peVar1->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x1b])
            (peVar1,(ulong)((peVar1->super_ChPhysicsItem).offset_x -
                           (this->assembly).super_ChPhysicsItem.offset_x),x,
             (ulong)((peVar1->super_ChPhysicsItem).offset_w -
                    (this->assembly).super_ChPhysicsItem.offset_w),v,T);
  *T = this->ch_time;
  return;
}

Assistant:

void ChSystem::StateGather(ChState& x, ChStateDelta& v, double& T) {
    unsigned int off_x = 0;
    unsigned int off_v = 0;

    // Operate on assembly items (bodies, links, etc.)
    assembly.IntStateGather(off_x, x, off_v, v, T);

    // Use also on contact container:
    unsigned int displ_x = off_x - assembly.offset_x;
    unsigned int displ_v = off_v - assembly.offset_w;
    contact_container->IntStateGather(displ_x + contact_container->GetOffset_x(), x,
                                      displ_v + contact_container->GetOffset_w(), v, T);

    T = ch_time;
}